

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::CollapseFullPath
                   (string *__return_storage_ptr__,string *in_path,char *in_base)

{
  string tmp_base;
  allocator<char> local_39;
  string local_38;
  
  if (in_base == (char *)0x0) {
    anon_unknown_11::CollapseFullPathImpl(__return_storage_ptr__,in_path,(string *)0x0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,in_base,&local_39);
    anon_unknown_11::CollapseFullPathImpl(__return_storage_ptr__,in_path,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CollapseFullPath(std::string const& in_path,
                                          const char* in_base)
{
  if (!in_base) {
    return CollapseFullPathImpl(in_path, nullptr);
  }
  std::string tmp_base = in_base;
  return CollapseFullPathImpl(in_path, &tmp_base);
}